

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O2

CURLcode Curl_pp_readresp(Curl_easy *data,curl_socket_t sockfd,pingpong *pp,int *code,size_t *size)

{
  curl_off_t *pcVar1;
  char *__src;
  char *pcVar2;
  _Bool _Var3;
  CURLcode CVar4;
  uint *puVar5;
  ulong uVar6;
  char *pcVar7;
  size_t sVar8;
  size_t size_00;
  bool bVar9;
  ulong uVar10;
  ssize_t gotbytes;
  curl_socket_t local_5c;
  int *local_58;
  char *local_50;
  size_t *local_48;
  char *local_40;
  connectdata *local_38;
  
  local_38 = data->conn;
  local_50 = (data->state).buffer;
  *code = 0;
  *size = 0;
  sVar8 = pp->nread_resp;
  pcVar7 = local_50 + sVar8;
  size_00 = (long)pcVar7 - (long)pp->linestart_resp;
  local_40 = local_50 + 1;
  bVar9 = true;
  CVar4 = CURLE_OK;
  local_5c = sockfd;
  local_48 = size;
  do {
    uVar10 = (ulong)(data->set).buffer_size;
    if (((uVar10 < sVar8 || uVar10 - sVar8 == 0) || (!bVar9)) || (CVar4 != CURLE_OK)) {
      pp->pending_resp = false;
      return CVar4;
    }
    if (pp->cache == (char *)0x0) {
      CVar4 = Curl_read(data,local_5c,pcVar7,uVar10 - sVar8,&gotbytes);
      if (CVar4 == CURLE_OK) goto LAB_004c018f;
      bVar9 = false;
      if (CVar4 == CURLE_AGAIN) {
        return CURLE_OK;
      }
    }
    else {
      if (local_40 + uVar10 < pcVar7 + pp->cache_size) {
        Curl_failf(data,"cached response data too big to handle");
        return CURLE_WEIRD_SERVER_REPLY;
      }
      memcpy(pcVar7,pp->cache,pp->cache_size);
      gotbytes = pp->cache_size;
      (*Curl_cfree)(pp->cache);
      pp->cache = (char *)0x0;
      pp->cache_size = 0;
LAB_004c018f:
      if (gotbytes < 1) {
        puVar5 = (uint *)__errno_location();
        bVar9 = false;
        Curl_failf(data,"response reading failed (errno: %d)",(ulong)*puVar5);
        CVar4 = CURLE_RECV_ERROR;
      }
      else {
        pcVar1 = &(data->req).headerbytecount;
        *pcVar1 = *pcVar1 + gotbytes;
        pp->nread_resp = pp->nread_resp + gotbytes;
        sVar8 = gotbytes;
        for (uVar10 = 0; (long)uVar10 < (long)sVar8; uVar10 = uVar10 + 1) {
          size_00 = size_00 + 1;
          if (pcVar7[uVar10] == '\n') {
            Curl_debug(data,CURLINFO_HEADER_IN,pp->linestart_resp,size_00);
            CVar4 = Curl_client_write(data,2,pp->linestart_resp,size_00);
            if (CVar4 != CURLE_OK) {
              return CVar4;
            }
            _Var3 = (*pp->endofresp)(data,local_38,pp->linestart_resp,size_00,code);
            pcVar2 = local_50;
            if (_Var3) {
              __src = pp->linestart_resp;
              local_58 = code;
              memmove(local_50,__src,(size_t)(pcVar7 + (uVar10 - (long)__src)));
              pcVar2[(long)(pcVar7 + (uVar10 - (long)__src))] = '\0';
              pp->linestart_resp = pcVar7 + uVar10 + 1;
              *local_48 = pp->nread_resp;
              pp->nread_resp = 0;
              code = local_58;
              if (gotbytes - 1U == uVar10) {
                bVar9 = false;
                goto LAB_004c0333;
              }
              size_00 = ~uVar10 + gotbytes;
              bVar9 = false;
              goto LAB_004c0300;
            }
            pp->linestart_resp = pcVar7 + uVar10 + 1;
            size_00 = 0;
            sVar8 = gotbytes;
          }
        }
        uVar6 = (ulong)((data->set).buffer_size >> 1);
        if ((size_00 == sVar8) && ((long)uVar6 < (long)sVar8)) {
          Curl_infof(data,"Excessive server response line length received, %zd bytes. Stripping");
          size_00 = 0x28;
LAB_004c030a:
          pp->cache_size = size_00;
          pcVar7 = (char *)(*Curl_cmalloc)(size_00);
          pp->cache = pcVar7;
          if (pcVar7 == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          memcpy(pcVar7,pp->linestart_resp,pp->cache_size);
        }
        else {
          if (pp->nread_resp <= uVar6) {
            pcVar7 = pcVar7 + uVar10;
            CVar4 = CURLE_OK;
            goto LAB_004c0346;
          }
LAB_004c0300:
          if (size_00 != 0) goto LAB_004c030a;
        }
LAB_004c0333:
        pp->nread_resp = 0;
        pp->linestart_resp = local_50;
        size_00 = 0;
        CVar4 = CURLE_OK;
        pcVar7 = local_50;
      }
    }
LAB_004c0346:
    sVar8 = pp->nread_resp;
  } while( true );
}

Assistant:

CURLcode Curl_pp_readresp(struct Curl_easy *data,
                          curl_socket_t sockfd,
                          struct pingpong *pp,
                          int *code, /* return the server code if done */
                          size_t *size) /* size of the response */
{
  ssize_t perline; /* count bytes per line */
  bool keepon = TRUE;
  ssize_t gotbytes;
  char *ptr;
  struct connectdata *conn = data->conn;
  char * const buf = data->state.buffer;
  CURLcode result = CURLE_OK;

  *code = 0; /* 0 for errors or not done */
  *size = 0;

  ptr = buf + pp->nread_resp;

  /* number of bytes in the current line, so far */
  perline = (ssize_t)(ptr-pp->linestart_resp);

  while((pp->nread_resp < (size_t)data->set.buffer_size) &&
        (keepon && !result)) {

    if(pp->cache) {
      /* we had data in the "cache", copy that instead of doing an actual
       * read
       *
       * pp->cache_size is cast to ssize_t here.  This should be safe, because
       * it would have been populated with something of size int to begin
       * with, even though its datatype may be larger than an int.
       */
      if((ptr + pp->cache_size) > (buf + data->set.buffer_size + 1)) {
        failf(data, "cached response data too big to handle");
        return CURLE_WEIRD_SERVER_REPLY;
      }
      memcpy(ptr, pp->cache, pp->cache_size);
      gotbytes = (ssize_t)pp->cache_size;
      free(pp->cache);    /* free the cache */
      pp->cache = NULL;   /* clear the pointer */
      pp->cache_size = 0; /* zero the size just in case */
    }
    else {
#ifdef HAVE_GSSAPI
      enum protection_level prot = conn->data_prot;
      conn->data_prot = PROT_CLEAR;
#endif
      DEBUGASSERT((ptr + data->set.buffer_size - pp->nread_resp) <=
                  (buf + data->set.buffer_size + 1));
      result = Curl_read(data, sockfd, ptr,
                         data->set.buffer_size - pp->nread_resp,
                         &gotbytes);
#ifdef HAVE_GSSAPI
      DEBUGASSERT(prot  > PROT_NONE && prot < PROT_LAST);
      conn->data_prot = prot;
#endif
      if(result == CURLE_AGAIN)
        return CURLE_OK; /* return */

      if(result)
        /* Set outer result variable to this error. */
        keepon = FALSE;
    }

    if(!keepon)
      ;
    else if(gotbytes <= 0) {
      keepon = FALSE;
      result = CURLE_RECV_ERROR;
      failf(data, "response reading failed (errno: %d)", SOCKERRNO);
    }
    else {
      /* we got a whole chunk of data, which can be anything from one
       * byte to a set of lines and possible just a piece of the last
       * line */
      ssize_t i;
      ssize_t clipamount = 0;
      bool restart = FALSE;

      data->req.headerbytecount += (long)gotbytes;

      pp->nread_resp += gotbytes;
      for(i = 0; i < gotbytes; ptr++, i++) {
        perline++;
        if(*ptr == '\n') {
          /* a newline is CRLF in pp-talk, so the CR is ignored as
             the line isn't really terminated until the LF comes */

          /* output debug output if that is requested */
#ifdef HAVE_GSSAPI
          if(!conn->sec_complete)
#endif
            Curl_debug(data, CURLINFO_HEADER_IN,
                       pp->linestart_resp, (size_t)perline);

          /*
           * We pass all response-lines to the callback function registered
           * for "headers". The response lines can be seen as a kind of
           * headers.
           */
          result = Curl_client_write(data, CLIENTWRITE_HEADER,
                                     pp->linestart_resp, perline);
          if(result)
            return result;

          if(pp->endofresp(data, conn, pp->linestart_resp, perline, code)) {
            /* This is the end of the last line, copy the last line to the
               start of the buffer and null-terminate, for old times sake */
            size_t n = ptr - pp->linestart_resp;
            memmove(buf, pp->linestart_resp, n);
            buf[n] = 0; /* null-terminate */
            keepon = FALSE;
            pp->linestart_resp = ptr + 1; /* advance pointer */
            i++; /* skip this before getting out */

            *size = pp->nread_resp; /* size of the response */
            pp->nread_resp = 0; /* restart */
            break;
          }
          perline = 0; /* line starts over here */
          pp->linestart_resp = ptr + 1;
        }
      }

      if(!keepon && (i != gotbytes)) {
        /* We found the end of the response lines, but we didn't parse the
           full chunk of data we have read from the server. We therefore need
           to store the rest of the data to be checked on the next invoke as
           it may actually contain another end of response already! */
        clipamount = gotbytes - i;
        restart = TRUE;
        DEBUGF(infof(data, "Curl_pp_readresp_ %d bytes of trailing "
                     "server response left",
                     (int)clipamount));
      }
      else if(keepon) {

        if((perline == gotbytes) &&
           (gotbytes > (ssize_t)data->set.buffer_size/2)) {
          /* We got an excessive line without newlines and we need to deal
             with it. We keep the first bytes of the line then we throw
             away the rest. */
          infof(data, "Excessive server response line length received, "
                "%zd bytes. Stripping", gotbytes);
          restart = TRUE;

          /* we keep 40 bytes since all our pingpong protocols are only
             interested in the first piece */
          clipamount = 40;
        }
        else if(pp->nread_resp > (size_t)data->set.buffer_size/2) {
          /* We got a large chunk of data and there's potentially still
             trailing data to take care of, so we put any such part in the
             "cache", clear the buffer to make space and restart. */
          clipamount = perline;
          restart = TRUE;
        }
      }
      else if(i == gotbytes)
        restart = TRUE;

      if(clipamount) {
        pp->cache_size = clipamount;
        pp->cache = malloc(pp->cache_size);
        if(pp->cache)
          memcpy(pp->cache, pp->linestart_resp, pp->cache_size);
        else
          return CURLE_OUT_OF_MEMORY;
      }
      if(restart) {
        /* now reset a few variables to start over nicely from the start of
           the big buffer */
        pp->nread_resp = 0; /* start over from scratch in the buffer */
        ptr = pp->linestart_resp = buf;
        perline = 0;
      }

    } /* there was data */

  } /* while there's buffer left and loop is requested */

  pp->pending_resp = FALSE;

  return result;
}